

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O1

int ARKBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                    void *bp_data)

{
  long lVar1;
  ARKodeMem ark_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  code *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  sunrealtype *psVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  char *msgfmt;
  long lVar22;
  long j;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_c0;
  long local_b0;
  double local_a8;
  long local_98;
  
  ark_mem = *(ARKodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar8 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x165;
      goto LAB_001221fa;
    }
    if (iVar8 != 0) {
      return 1;
    }
    uVar2 = *(undefined8 *)((long)bp_data + 0x30);
    uVar3 = *(undefined8 *)((long)bp_data + 0x38);
    lVar4 = *(long *)((long)bp_data + 0x48);
    pcVar9 = (code *)(**(code **)(lVar4 + 0x130))();
    if (pcVar9 == (code *)0x0) {
      iVar8 = -1;
    }
    else {
      lVar10 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 0x210));
      lVar11 = N_VGetArrayPointer(fy);
      lVar12 = N_VGetArrayPointer(uVar2);
      lVar13 = N_VGetArrayPointer(y);
      lVar14 = N_VGetArrayPointer(uVar3);
      if (*(int *)(lVar4 + 0x80) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = N_VGetArrayPointer(*(undefined8 *)(lVar4 + 0x270));
      }
      local_a8 = 1.0;
      N_VScale(y,uVar3);
      dVar24 = *(double *)(lVar4 + 8);
      local_c0 = 0.0;
      if (0.0 < dVar24) {
        if (dVar24 < 0.0) {
          local_c0 = sqrt(dVar24);
        }
        else {
          local_c0 = SQRT(dVar24);
        }
      }
      dVar24 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar4 + 0x218));
      if ((dVar24 != 0.0) || (NAN(dVar24))) {
        local_a8 = dVar24 * (double)*bp_data *
                            ABS(*(double *)(lVar4 + 0x2a0)) * 1000.0 * *(double *)(lVar4 + 8);
      }
      lVar5 = *(long *)((long)bp_data + 8);
      lVar6 = *(long *)((long)bp_data + 0x10);
      lVar22 = lVar6 + lVar5 + 1;
      lVar16 = *bp_data;
      if (lVar22 < *bp_data) {
        lVar16 = lVar22;
      }
      if (0 < lVar16) {
        local_98 = 0;
        lVar17 = 1;
        do {
          j = lVar17 + -1;
          lVar20 = *bp_data;
          if (lVar17 <= lVar20) {
            iVar8 = *(int *)(lVar4 + 0x80);
            lVar19 = j;
            do {
              dVar24 = *(double *)(lVar13 + lVar19 * 8);
              dVar26 = local_a8 / *(double *)(lVar10 + lVar19 * 8);
              dVar25 = ABS(dVar24) * local_c0;
              if (ABS(dVar24) * local_c0 <= dVar26) {
                dVar25 = dVar26;
              }
              if (iVar8 != 0) {
                dVar26 = *(double *)(local_b0 + lVar19 * 8);
                dVar27 = ABS(dVar26);
                if ((dVar27 != 1.0) || (NAN(dVar27))) {
                  if ((dVar27 == 2.0) && ((!NAN(dVar27) && ((dVar24 + dVar25) * dVar26 <= 0.0))))
                  goto LAB_001223dd;
                }
                else if ((dVar24 + dVar25) * dVar26 < 0.0) {
LAB_001223dd:
                  dVar25 = -dVar25;
                }
              }
              *(double *)(lVar14 + lVar19 * 8) = dVar25 + *(double *)(lVar14 + lVar19 * 8);
              lVar19 = lVar19 + lVar22;
            } while (lVar19 < lVar20);
          }
          iVar8 = (*pcVar9)(t,uVar3,uVar2,*(undefined8 *)(lVar4 + 0x10));
          *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
          if (iVar8 != 0) goto LAB_00122606;
          lVar20 = local_98;
          if (lVar17 <= *bp_data) {
            do {
              dVar24 = *(double *)(lVar13 + j * 8);
              *(double *)(lVar14 + j * 8) = dVar24;
              psVar15 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
              dVar26 = local_a8 / *(double *)(lVar10 + j * 8);
              dVar25 = ABS(*(double *)(lVar13 + j * 8)) * local_c0;
              if (dVar25 <= dVar26) {
                dVar25 = dVar26;
              }
              if (*(int *)(lVar4 + 0x80) != 0) {
                dVar26 = *(double *)(local_b0 + j * 8);
                dVar27 = ABS(dVar26);
                if ((dVar27 != 1.0) || (NAN(dVar27))) {
                  if ((dVar27 == 2.0) && ((!NAN(dVar27) && ((dVar24 + dVar25) * dVar26 <= 0.0)))) {
                    dVar25 = -dVar25;
                  }
                }
                else if ((dVar24 + dVar25) * dVar26 < 0.0) {
                  dVar25 = -dVar25;
                }
              }
              lVar18 = j - *(long *)((long)bp_data + 0x10);
              lVar19 = 0;
              if (0 < lVar18) {
                lVar19 = lVar18;
              }
              lVar7 = *bp_data;
              lVar21 = *(long *)((long)bp_data + 8) + j;
              lVar1 = lVar7 + -1;
              if (lVar1 <= lVar21) {
                lVar21 = lVar1;
              }
              if (lVar19 <= lVar21) {
                if (lVar18 < 1) {
                  lVar18 = 0;
                }
                lVar18 = lVar18 + -1;
                do {
                  *(double *)((long)psVar15 + lVar18 * 8 + lVar20 + 8) =
                       (*(double *)(lVar12 + 8 + lVar18 * 8) - *(double *)(lVar11 + 8 + lVar18 * 8))
                       * (1.0 / dVar25);
                  lVar18 = lVar18 + 1;
                } while (lVar18 < lVar21);
              }
              j = j + lVar22;
              lVar20 = lVar20 + ~(lVar5 + lVar6) * 8;
            } while (j < lVar7);
          }
          local_98 = local_98 + -8;
          bVar23 = lVar17 != lVar16;
          lVar17 = lVar17 + 1;
        } while (bVar23);
      }
      iVar8 = 0;
    }
LAB_00122606:
    if (iVar8 < 0) {
      msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
      iVar8 = 0x16e;
      goto LAB_001221fa;
    }
    if (iVar8 != 0) {
      return 1;
    }
    iVar8 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x177;
      goto LAB_001221fa;
    }
  }
  else {
    *jcurPtr = 0;
    iVar8 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar8 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar8 = 0x158;
      goto LAB_001221fa;
    }
  }
  if (iVar8 != 0) {
    return 1;
  }
  iVar8 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar8 == 0) {
    iVar8 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar8;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar8 = 0x182;
LAB_001221fa:
  arkProcessError(ark_mem,-1,iVar8,"ARKBandPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int ARKBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                            sunbooleantype jok, sunbooleantype* jcurPtr,
                            sunrealtype gamma, void* bp_data)
{
  ARKBandPrecData pdata;
  ARKodeMem ark_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (ARKBandPrecData)bp_data;

  ark_mem = (ARKodeMem)pdata->arkode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call ARKBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = ARKBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}